

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O1

int __thiscall
opengv::absolute_pose::OptimizeNonlinearFunctor1::operator()
          (OptimizeNonlinearFunctor1 *this,VectorXd *x,VectorXd *fvec)

{
  double dVar1;
  double dVar2;
  undefined1 (*pauVar3) [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  PointerType ptr;
  Indices *pIVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  double dVar22;
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  rotation_t rotation;
  cayley_t cayley;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [64];
  double local_188;
  double dStack_180;
  double local_178;
  double local_170;
  double dStack_168;
  undefined8 local_160;
  double local_158;
  double dStack_150;
  double local_148;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 local_110;
  double local_108;
  double local_100;
  ulong local_f8;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  double local_98;
  cayley_t local_88 [3];
  
  pauVar3 = (undefined1 (*) [16])
            (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  dVar7 = *(double *)*pauVar3;
  auVar4 = *pauVar3;
  dVar1 = *(double *)pauVar3[1];
  local_1e8._8_8_ = dVar1;
  local_1e8._0_8_ = dVar1;
  dVar2 = *(double *)*pauVar3;
  local_1c8._8_8_ = *(undefined8 *)(*pauVar3 + 8);
  local_1c8._0_8_ = *(undefined8 *)(*pauVar3 + 8);
  local_88[0].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = *(double *)(pauVar3[1] + 8);
  local_88[0].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = *(double *)pauVar3[2];
  local_88[0].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = *(double *)(pauVar3[2] + 8);
  math::cayley2rot(local_88);
  pIVar11 = this->_indices;
  if (pIVar11->_numberCorrespondences != 0) {
    auVar5._8_8_ = uStack_130;
    auVar5._0_8_ = local_138;
    local_b8 = vpinsrq_avx(auVar5,uStack_120,1);
    auVar17._8_8_ = local_128;
    auVar17._0_8_ = uStack_130;
    local_c8 = vpinsrq_avx(auVar17,local_118,1);
    auVar9._8_8_ = uStack_120;
    auVar9._0_8_ = local_128;
    local_d8 = vpinsrq_avx(auVar9,local_110,1);
    local_e8._8_8_ = 0;
    local_e8._0_8_ = local_f8;
    auVar18._0_8_ = local_b8._0_8_ * dVar2;
    auVar18._8_8_ = local_b8._8_8_ * dVar2;
    auVar5 = vfnmsub213pd_fma(local_1c8._0_16_,local_c8,auVar18);
    auVar5 = vfnmadd231pd_fma(auVar5,local_d8,local_1e8);
    auVar16._8_8_ = 0x8000000000000000;
    auVar16._0_8_ = 0x8000000000000000;
    auVar16 = vxorpd_avx512vl(local_e8,auVar16);
    auVar4 = vshufpd_avx(auVar4,auVar4,1);
    lVar15 = 0;
    uVar14 = 0;
    do {
      iVar13 = (int)uVar14;
      lVar12 = lVar15 >> 0x1e;
      iVar10 = iVar13;
      if (pIVar11->_useIndices != false) {
        iVar10 = *(int *)((long)(pIVar11->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar12);
      }
      (*this->_adapter->_vptr_AbsoluteAdapterBase[6])(&local_188,this->_adapter,(long)iVar10);
      dVar2 = local_178;
      dVar20 = dStack_180;
      auVar6._8_8_ = local_188;
      auVar6._0_8_ = local_188;
      auVar17 = vmulpd_avx512vl(local_b8,auVar6);
      iVar10 = iVar13;
      if (this->_indices->_useIndices != false) {
        iVar10 = *(int *)((long)(this->_indices->_indices->
                                super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start + lVar12);
      }
      local_1e8._8_8_ = local_178;
      local_1e8._0_8_ = local_178;
      dVar22 = local_108 * local_188;
      (*this->_adapter->_vptr_AbsoluteAdapterBase[5])(&local_188,this->_adapter,(long)iVar10);
      iVar10 = iVar13;
      if (this->_indices->_useIndices != false) {
        iVar10 = *(int *)((long)(this->_indices->_indices->
                                super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start + lVar12);
      }
      auVar8._8_8_ = dVar20;
      auVar8._0_8_ = dVar20;
      auVar17 = vfmadd231pd_fma(auVar17,auVar8,local_c8);
      auVar17 = vfmadd231pd_fma(auVar17,local_1e8,local_d8);
      local_1c8._0_8_ = auVar5._0_8_;
      local_1c8._8_8_ = auVar5._8_8_;
      local_1d8._8_8_ = auVar17._8_8_ + (double)local_1c8._8_8_;
      local_1d8._0_8_ = auVar17._0_8_ + (double)local_1c8._0_8_;
      dVar2 = dVar2 * (double)local_e8._0_8_;
      (*this->_adapter->_vptr_AbsoluteAdapterBase[4])(local_a8,this->_adapter,(long)iVar10);
      auVar17 = vsubpd_avx(local_1d8,local_a8);
      dVar2 = (dVar20 * local_100 + dVar22 +
              dVar2 + ((dVar1 * auVar16._0_8_ - auVar4._0_8_ * local_100) - dVar7 * local_108)) -
              local_98;
      dVar20 = auVar17._0_8_;
      dVar22 = auVar17._8_8_;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = local_178;
      auVar17 = vmovhpd_avx(auVar23,local_160);
      if (this->_indices->_useIndices != false) {
        iVar13 = *(int *)((long)(this->_indices->_indices->
                                super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start + lVar12);
      }
      auVar19._0_8_ = dVar2 * auVar17._0_8_ + dVar20 * local_188 + dVar22 * dStack_180;
      auVar19._8_8_ = dVar2 * auVar17._8_8_ + dVar20 * local_170 + dVar22 * dStack_168;
      dVar2 = dVar2 * local_148 + dVar20 * local_158 + dVar22 * dStack_150;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = dVar2 * dVar2 + auVar19._0_8_ * auVar19._0_8_ + auVar19._8_8_ * auVar19._8_8_;
      auVar17 = vsqrtpd_avx(auVar21);
      dVar20 = auVar17._0_8_;
      auVar24._8_8_ = dVar20;
      auVar24._0_8_ = dVar20;
      auVar17 = vdivpd_avx(auVar19,auVar24);
      (*this->_adapter->_vptr_AbsoluteAdapterBase[2])(&local_188,this->_adapter,(long)iVar13);
      local_1e8._0_8_ = auVar17._0_8_;
      local_1e8._8_8_ = auVar17._8_8_;
      (fvec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      [uVar14] = 1.0 - ((double)local_1e8._0_8_ * local_188 + (double)local_1e8._8_8_ * dStack_180 +
                       (dVar2 / dVar20) * local_178);
      uVar14 = uVar14 + 1;
      pIVar11 = this->_indices;
      lVar15 = lVar15 + 0x100000000;
    } while (uVar14 < pIVar11->_numberCorrespondences);
  }
  return 0;
}

Assistant:

int operator()(const VectorXd &x, VectorXd &fvec) const
  {
    assert( x.size() == 6 );
    assert( (unsigned int) fvec.size() == _indices.size());

    //compute the current position
    translation_t translation = x.block<3,1>(0,0);
    cayley_t cayley = x.block<3,1>(3,0);
    rotation_t rotation = math::cayley2rot(cayley);

    //compute inverse transformation
    transformation_t inverseSolution;
    inverseSolution.block<3,3>(0,0) = rotation.transpose();
    inverseSolution.col(3) = -inverseSolution.block<3,3>(0,0)*translation;

    Eigen::Matrix<double,4,1> p_hom;
    p_hom[3] = 1.0;

    for(size_t i = 0; i < _indices.size(); i++)
    {
      //get point in homogeneous form
      p_hom.block<3,1>(0,0) = _adapter.getPoint(_indices[i]);

      //compute the reprojection (this is working for both central and
      //non-central case)
      point_t bodyReprojection = inverseSolution * p_hom;
      point_t reprojection = _adapter.getCamRotation(_indices[i]).transpose() *
          (bodyReprojection - _adapter.getCamOffset(_indices[i]));
      reprojection = reprojection / reprojection.norm();

      //compute the score
      double factor = 1.0;
      fvec[i] = factor *
          (1.0 -
          (reprojection.transpose() * _adapter.getBearingVector(_indices[i])));
    }

    return 0;
  }